

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.cpp
# Opt level: O2

void __thiscall httprouter::node::node(node *this)

{
  _tree_node *__p;
  allocator local_12;
  allocator local_11;
  
  __p = (_tree_node *)operator_new(0x78);
  std::__cxx11::string::string((string *)__p,"",&local_11);
  std::__cxx11::string::string((string *)&__p->indices,"",&local_12);
  *(undefined8 *)((long)&(__p->handle).super__Function_base._M_functor + 8) = 0;
  (__p->handle).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(__p->handle).super__Function_base._M_functor = 0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->handle)._M_invoker = (_Invoker_type)0x0;
  std::__shared_ptr<httprouter::_tree_node,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<httprouter::_tree_node,void>
            ((__shared_ptr<httprouter::_tree_node,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  return;
}

Assistant:

node::node()
	:node_(new tree_node_t{
	  path:       "",
	  indices:    "",
	  children:   {},
	  handle:     nullptr,
		})
{
}